

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

int get_section_target_bandwidth(AV1_COMP *cpi)

{
  long local_40;
  int frames_left;
  int64_t section_target_bandwidth;
  TWO_PASS *twopass;
  RATE_CONTROL *rc;
  CurrentFrame *current_frame;
  AV1_COMMON *cm;
  AV1_COMP *cpi_local;
  
  if (cpi->ppi->lap_enabled == 0) {
    local_40 = (cpi->ppi->twopass).bits_left /
               (long)(int)(((cpi->ppi->twopass).stats_buf_ctx)->total_stats->count -
                          (double)(cpi->common).current_frame.frame_number);
    if (0x7ffffffe < local_40) {
      local_40 = 0x7fffffff;
    }
    section_target_bandwidth._0_4_ = (int)local_40;
  }
  else {
    section_target_bandwidth._0_4_ = (cpi->rc).avg_frame_bandwidth;
  }
  return (int)section_target_bandwidth;
}

Assistant:

static int get_section_target_bandwidth(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  CurrentFrame *const current_frame = &cm->current_frame;
  RATE_CONTROL *const rc = &cpi->rc;
  TWO_PASS *const twopass = &cpi->ppi->twopass;
  int64_t section_target_bandwidth;
  const int frames_left = (int)(twopass->stats_buf_ctx->total_stats->count -
                                current_frame->frame_number);
  if (cpi->ppi->lap_enabled)
    section_target_bandwidth = rc->avg_frame_bandwidth;
  else {
    section_target_bandwidth = twopass->bits_left / frames_left;
    section_target_bandwidth = AOMMIN(section_target_bandwidth, INT_MAX);
  }
  return (int)section_target_bandwidth;
}